

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i18n.cpp
# Opt level: O0

string * __thiscall
I18N::FormatV(string *__return_storage_ptr__,I18N *this,string *id,
             vector<util::variant,_std::allocator<util::variant>_> *v)

{
  iterator this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer pCVar4;
  reference pvVar5;
  pointer ppVar6;
  reference pcVar7;
  size_type sVar8;
  reference this_01;
  string local_1c0;
  variant local_1a0;
  size_type local_160;
  size_t index;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_150;
  char c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  undefined1 local_130 [4];
  int state;
  string number_buffer;
  string format;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_98 [8];
  variant x;
  iterator __end2;
  iterator __begin2;
  vector<util::variant,_std::allocator<util::variant>_> *__range2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  local_30;
  iterator it;
  vector<util::variant,_std::allocator<util::variant>_> *v_local;
  string *id_local;
  I18N *this_local;
  string *result;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
               )v;
  pCVar4 = std::unique_ptr<Config,_std::default_delete<Config>_>::operator->(&this->lang_config);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
       ::find(&pCVar4->
               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ,id);
  pCVar4 = std::unique_ptr<Config,_std::default_delete<Config>_>::operator->(&this->lang_config);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
       ::end(&pCVar4->
              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            );
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)id);
    this_00 = it;
    __end2 = std::vector<util::variant,_std::allocator<util::variant>_>::begin
                       ((vector<util::variant,_std::allocator<util::variant>_> *)
                        it.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                        ._M_cur);
    x._56_8_ = std::vector<util::variant,_std::allocator<util::variant>_>::end
                         ((vector<util::variant,_std::allocator<util::variant>_> *)
                          this_00.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                          ._M_cur);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<util::variant_*,_std::vector<util::variant,_std::allocator<util::variant>_>_>
                                       *)&x.type), bVar1) {
      pvVar5 = __gnu_cxx::
               __normal_iterator<util::variant_*,_std::vector<util::variant,_std::allocator<util::variant>_>_>
               ::operator*(&__end2);
      util::variant::variant((variant *)local_98,pvVar5);
      util::variant::operator_cast_to_string(&local_e8,(variant *)local_98);
      std::operator+(&local_c8," ",&local_e8);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      util::variant::~variant((variant *)local_98);
      __gnu_cxx::
      __normal_iterator<util::variant_*,_std::vector<util::variant,_std::allocator<util::variant>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                           *)&local_30);
    util::variant::operator_cast_to_string
              ((string *)((long)&number_buffer.field_2 + 8),&ppVar6->second);
    std::__cxx11::string::string((string *)local_130);
    bVar1 = false;
    __end1._M_current = (char *)std::__cxx11::string::begin();
    _Stack_150._M_current = (char *)std::__cxx11::string::end();
    while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffeb0), bVar2) {
      pcVar7 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
      index._7_1_ = *pcVar7;
      if (bVar1) {
        if (bVar1) {
          if (index._7_1_ == '}') {
            util::variant::variant(&local_1a0,(string *)local_130);
            iVar3 = util::variant::operator_cast_to_int(&local_1a0);
            util::variant::~variant(&local_1a0);
            local_160 = (long)(iVar3 + -1);
            sVar8 = std::vector<util::variant,_std::allocator<util::variant>_>::size
                              ((vector<util::variant,_std::allocator<util::variant>_> *)
                               it.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                               ._M_cur);
            if ((ulong)(long)(iVar3 + -1) < sVar8) {
              this_01 = std::vector<util::variant,_std::allocator<util::variant>_>::operator[]
                                  ((vector<util::variant,_std::allocator<util::variant>_> *)
                                   it.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                                   ._M_cur,local_160);
              util::variant::operator_cast_to_string(&local_1c0,this_01);
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_1c0);
              std::__cxx11::string::~string((string *)&local_1c0);
            }
            else {
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"#ERROR#");
            }
            std::__cxx11::string::operator=((string *)local_130,"");
            bVar1 = false;
          }
          else {
            std::__cxx11::string::operator+=((string *)local_130,index._7_1_);
          }
        }
      }
      else if (index._7_1_ == '{') {
        bVar1 = true;
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,index._7_1_);
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)(number_buffer.field_2._M_local_buf + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string I18N::FormatV(const std::string& id, std::vector<util::variant> &&v) const
{
	auto it = lang_config->find(id);

	if (it == lang_config->end())
	{
		std::string result = id;

		UTIL_FOREACH(v, x)
		{
			result += " " + std::string(x);
		}

		return result;
	}

	std::string result;
	std::string format = std::string(it->second);
	std::string number_buffer;
	int state = 0;

	UTIL_FOREACH(format, c)
	{
		if (state == 0)
		{
			if (c == '{')
			{
				state = 1;
			}
			else
			{
				result += c;
			}
		}
		else if (state == 1)
		{
			if (c == '}')
			{
				std::size_t index = int(util::variant(number_buffer)) - 1;

				if (index >= v.size())
					result += "#ERROR#";
				else
					result += std::string(v[index]);

				number_buffer = "";
				state = 0;
			}
			else
			{
				number_buffer += c;
			}
		}
	}

	return result;
}